

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O1

void __thiscall ipx::Model::PrintCoefficientRange(Model *this,Control *control)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer piVar4;
  size_t sVar5;
  ostream *poVar6;
  double *pdVar7;
  double *pdVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  double dVar12;
  fmtflags in_R8D;
  double dVar13;
  double dVar14;
  stringstream h_logging_stream;
  double local_238;
  double local_228;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  piVar4 = (this->A_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar9 = (int)((ulong)((long)(this->A_).colptr_.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)piVar4) >> 2) - 1;
  if ((int)uVar9 < 1) {
    local_228 = 0.0;
    local_238 = INFINITY;
  }
  else {
    local_238 = INFINITY;
    uVar10 = 0;
    local_228 = 0.0;
    do {
      lVar11 = (long)piVar4[uVar10];
      in_R8D = piVar4[uVar10 + 1];
      if (piVar4[uVar10] < in_R8D) {
        do {
          dVar14 = (this->A_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar11];
          if ((dVar14 != 0.0) || (dVar13 = local_228, NAN(dVar14))) {
            dVar13 = ABS(dVar14);
            dVar14 = dVar13;
            if (local_238 <= dVar13) {
              dVar14 = local_238;
            }
            local_238 = dVar14;
            if (dVar13 <= local_228) {
              dVar13 = local_228;
            }
          }
          local_228 = dVar13;
          lVar11 = lVar11 + 1;
        } while (in_R8D != lVar11);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar9);
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  paVar1 = &local_218.field_2;
  local_218._M_string_length = 0;
  local_218.field_2._M_local_buf[0] = '\0';
  local_218._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p);
  }
  Textline<char[14]>(&local_218,(char (*) [14])"Matrix range:");
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"[",1);
  Format_abi_cxx11_(&local_1d8,(ipx *)0x5,
                    (double)(~-(ulong)(INFINITY <= local_238) & (ulong)local_238),0,0x100,in_R8D);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
  Format_abi_cxx11_(&local_1f8,(ipx *)0x5,local_228,0,0x100,in_R8D);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]\n",2);
  paVar2 = &local_1f8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  paVar3 = &local_1d8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar3) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p);
  }
  Control::hLog(control,(stringstream *)local_1b8);
  sVar5 = (this->scaled_rhs_)._M_size;
  pdVar7 = (this->scaled_rhs_)._M_data;
  pdVar8 = pdVar7 + sVar5;
  if (sVar5 == 0) {
    pdVar8 = (double *)0x0;
    pdVar7 = (double *)0x0;
  }
  if (pdVar7 == pdVar8) {
    local_238 = 0.0;
    local_228 = INFINITY;
  }
  else {
    local_228 = INFINITY;
    local_238 = 0.0;
    do {
      dVar14 = *pdVar7;
      if ((dVar14 != 0.0) || (dVar13 = local_238, NAN(dVar14))) {
        dVar13 = ABS(dVar14);
        dVar14 = dVar13;
        if (local_228 <= dVar13) {
          dVar14 = local_228;
        }
        local_228 = dVar14;
        if (dVar13 <= local_238) {
          dVar13 = local_238;
        }
      }
      local_238 = dVar13;
      pdVar7 = pdVar7 + 1;
    } while (pdVar7 != pdVar8);
  }
  Textline<char[11]>(&local_218,(char (*) [11])"RHS range:");
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"[",1);
  Format_abi_cxx11_(&local_1d8,(ipx *)0x5,
                    (double)(~-(ulong)(INFINITY <= local_228) & (ulong)local_228),0,0x100,in_R8D);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
  Format_abi_cxx11_(&local_1f8,(ipx *)0x5,local_238,0,0x100,in_R8D);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar3) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p);
  }
  Control::hLog(control,(stringstream *)local_1b8);
  sVar5 = (this->scaled_obj_)._M_size;
  pdVar7 = (this->scaled_obj_)._M_data;
  pdVar8 = pdVar7 + sVar5;
  if (sVar5 == 0) {
    pdVar8 = (double *)0x0;
    pdVar7 = (double *)0x0;
  }
  if (pdVar7 == pdVar8) {
    local_238 = 0.0;
    local_228 = INFINITY;
  }
  else {
    local_228 = INFINITY;
    local_238 = 0.0;
    do {
      dVar14 = *pdVar7;
      if ((dVar14 != 0.0) || (dVar13 = local_238, NAN(dVar14))) {
        dVar13 = ABS(dVar14);
        dVar14 = dVar13;
        if (local_228 <= dVar13) {
          dVar14 = local_228;
        }
        local_228 = dVar14;
        if (dVar13 <= local_238) {
          dVar13 = local_238;
        }
      }
      local_238 = dVar13;
      pdVar7 = pdVar7 + 1;
    } while (pdVar7 != pdVar8);
  }
  Textline<char[17]>(&local_218,(char (*) [17])"Objective range:");
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"[",1);
  Format_abi_cxx11_(&local_1d8,(ipx *)0x5,
                    (double)(~-(ulong)(INFINITY <= local_228) & (ulong)local_228),0,0x100,in_R8D);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
  Format_abi_cxx11_(&local_1f8,(ipx *)0x5,local_238,0,0x100,in_R8D);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar3) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p);
  }
  Control::hLog(control,(stringstream *)local_1b8);
  sVar5 = (this->scaled_lbuser_)._M_size;
  pdVar7 = (this->scaled_lbuser_)._M_data;
  pdVar8 = pdVar7 + sVar5;
  if (sVar5 == 0) {
    pdVar8 = (double *)0x0;
    pdVar7 = (double *)0x0;
  }
  if (pdVar7 == pdVar8) {
    local_238 = 0.0;
    local_228 = INFINITY;
  }
  else {
    local_228 = INFINITY;
    local_238 = 0.0;
    do {
      dVar13 = ABS(*pdVar7);
      uVar10 = (long)dVar13 - 1;
      in_R8D = (fmtflags)CONCAT71((int7)(uVar10 >> 8),0xffffffffffffe < uVar10);
      dVar14 = local_238;
      if (0xffffffffffffe >= uVar10 ||
          (uint)((ulong)((long)dVar13 + -0x10000000000000) >> 0x35) < 0x3ff) {
        dVar14 = ABS(*pdVar7);
        dVar13 = dVar14;
        if (local_228 <= dVar14) {
          dVar13 = local_228;
        }
        local_228 = dVar13;
        if (dVar14 <= local_238) {
          dVar14 = local_238;
        }
      }
      local_238 = dVar14;
      pdVar7 = pdVar7 + 1;
    } while (pdVar7 != pdVar8);
  }
  sVar5 = (this->scaled_ubuser_)._M_size;
  pdVar7 = (this->scaled_ubuser_)._M_data;
  pdVar8 = pdVar7 + sVar5;
  dVar14 = local_238;
  dVar13 = local_228;
  if (sVar5 == 0) {
    pdVar8 = (double *)0x0;
    pdVar7 = (double *)0x0;
  }
  for (; pdVar7 != pdVar8; pdVar7 = pdVar7 + 1) {
    dVar12 = ABS(*pdVar7);
    uVar10 = (long)dVar12 - 1;
    in_R8D = (fmtflags)CONCAT71((int7)(uVar10 >> 8),0xffffffffffffe < uVar10);
    local_238 = dVar14;
    local_228 = dVar13;
    if (0xffffffffffffe >= uVar10 ||
        (uint)((ulong)((long)dVar12 + -0x10000000000000) >> 0x35) < 0x3ff) {
      local_238 = ABS(*pdVar7);
      local_228 = local_238;
      if (dVar13 <= local_238) {
        local_228 = dVar13;
      }
      if (local_238 <= dVar14) {
        local_238 = dVar14;
      }
    }
    dVar14 = local_238;
    dVar13 = local_228;
  }
  Textline<char[14]>(&local_218,(char (*) [14])"Bounds range:");
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"[",1);
  Format_abi_cxx11_(&local_1d8,(ipx *)0x5,(double)(~-(ulong)(INFINITY <= dVar13) & (ulong)dVar13),0,
                    0x100,in_R8D);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
  Format_abi_cxx11_(&local_1f8,(ipx *)0x5,dVar14,0,0x100,in_R8D);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar3) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar1) {
    operator_delete(local_218._M_dataplus._M_p);
  }
  Control::hLog(control,(stringstream *)local_1b8);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void Model::PrintCoefficientRange(const Control& control) const {
    double amin = INFINITY;
    double amax = 0.0;
    for (Int j = 0; j < A_.cols(); j++) {
        for (Int p = A_.begin(j); p < A_.end(j); p++) {
            double x = A_.value(p);
            if (x != 0.0) {
                amin = std::min(amin, std::abs(x));
                amax = std::max(amax, std::abs(x));
            }
        }
    }
    if (amin == INFINITY)       // no nonzero entries in A_
        amin = 0.0;
    std::stringstream h_logging_stream;
    h_logging_stream.str(std::string());
    h_logging_stream
      << Textline("Matrix range:")
      << "[" << Scientific(amin, 5, 0) << ", "
      << Scientific(amax, 5, 0) << "]\n";
    control.hLog(h_logging_stream);

    double rhsmin = INFINITY;
    double rhsmax = 0.0;
    for (double x : scaled_rhs_) {
        if (x != 0.0) {
            rhsmin = std::min(rhsmin, std::abs(x));
            rhsmax = std::max(rhsmax, std::abs(x));
        }
    }
    if (rhsmin == INFINITY)     // no nonzero entries in rhs
        rhsmin = 0.0;
    h_logging_stream
      << Textline("RHS range:")
      << "[" << Scientific(rhsmin, 5, 0) << ", "
      << Scientific(rhsmax, 5, 0) << "]\n";
    control.hLog(h_logging_stream);

    double objmin = INFINITY;
    double objmax = 0.0;
    for (double x : scaled_obj_) {
        if (x != 0.0) {
            objmin = std::min(objmin, std::abs(x));
            objmax = std::max(objmax, std::abs(x));
        }
    }
    if (objmin == INFINITY)     // no nonzero entries in obj
        objmin = 0.0;
    h_logging_stream
      << Textline("Objective range:")
      << "[" << Scientific(objmin, 5, 0) << ", "
      << Scientific(objmax, 5, 0) << "]\n";
    control.hLog(h_logging_stream);

    double boundmin = INFINITY;
    double boundmax = 0.0;
    for (double x : scaled_lbuser_) {
        if (x != 0.0 && std::isfinite(x)) {
            boundmin = std::min(boundmin, std::abs(x));
            boundmax = std::max(boundmax, std::abs(x));
        }
    }
    for (double x : scaled_ubuser_) {
        if (x != 0.0 && std::isfinite(x)) {
            boundmin = std::min(boundmin, std::abs(x));
            boundmax = std::max(boundmax, std::abs(x));
        }
    }
    if (boundmin == INFINITY)   // no finite nonzeros entries in bounds
        boundmin = 0.0;
    h_logging_stream
      << Textline("Bounds range:")
      << "[" << Scientific(boundmin, 5, 0) << ", "
      << Scientific(boundmax, 5, 0) << "]\n";
    control.hLog(h_logging_stream);
}